

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
::AdvancePastEmptyBuckets
          (DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
           *this)

{
  bool bVar1;
  CancellationDelegate *RHS;
  CancellationDelegate *RHS_00;
  CancellationDelegate **ppCVar2;
  bool local_2a;
  bool local_29;
  CancellationDelegate *Tombstone;
  CancellationDelegate *Empty;
  DenseMapIterator<llbuild::core::CancellationDelegate_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llbuild::core::CancellationDelegate_*>,_llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate_*>,_false>
  *this_local;
  
  if (this->Ptr <= this->End) {
    RHS = DenseMapInfo<llbuild::core::CancellationDelegate_*>::getEmptyKey();
    RHS_00 = DenseMapInfo<llbuild::core::CancellationDelegate_*>::getTombstoneKey();
    while( true ) {
      local_29 = false;
      if (this->Ptr != this->End) {
        ppCVar2 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(this->Ptr);
        bVar1 = DenseMapInfo<llbuild::core::CancellationDelegate_*>::isEqual(*ppCVar2,RHS);
        local_2a = true;
        if (!bVar1) {
          ppCVar2 = detail::DenseSetPair<llbuild::core::CancellationDelegate_*>::getFirst(this->Ptr)
          ;
          local_2a = DenseMapInfo<llbuild::core::CancellationDelegate_*>::isEqual(*ppCVar2,RHS_00);
        }
        local_29 = local_2a;
      }
      if (local_29 == false) break;
      this->Ptr = this->Ptr + 1;
    }
    return;
  }
  __assert_fail("Ptr <= End",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x4ad,
                "void llvm::DenseMapIterator<llbuild::core::CancellationDelegate *, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>>::AdvancePastEmptyBuckets() [KeyT = llbuild::core::CancellationDelegate *, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<llbuild::core::CancellationDelegate *>, Bucket = llvm::detail::DenseSetPair<llbuild::core::CancellationDelegate *>, IsConst = false]"
               );
}

Assistant:

void AdvancePastEmptyBuckets() {
    assert(Ptr <= End);
    const KeyT Empty = KeyInfoT::getEmptyKey();
    const KeyT Tombstone = KeyInfoT::getTombstoneKey();

    while (Ptr != End && (KeyInfoT::isEqual(Ptr->getFirst(), Empty) ||
                          KeyInfoT::isEqual(Ptr->getFirst(), Tombstone)))
      ++Ptr;
  }